

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cpp
# Opt level: O0

PSNodesSeq * __thiscall
dg::pta::LLVMPointerGraphBuilder::createAtomicRMW(LLVMPointerGraphBuilder *this,Instruction *Inst)

{
  uint64_t o;
  PSNode *this_00;
  PSNodesSeq *in_RSI;
  SubgraphNode<dg::pta::PSNode> *in_RDI;
  PSNodesSeq ret;
  PSNode *W;
  PSNode *M;
  PSNode *R;
  Offset cval;
  PSNode *ptr;
  BinOp operation;
  AtomicRMWInst *RMW;
  PSNodesSeq *in_stack_ffffffffffffff28;
  Value *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  BinOp BVar1;
  initializer_list<dg::pta::PSNode_*> *in_stack_ffffffffffffff48;
  PSNodesSeq *in_stack_ffffffffffffff50;
  PSNodesSeq *in_stack_ffffffffffffff60;
  PSNode *val;
  Offset local_50;
  PSNode *local_48;
  PSNode *local_40;
  Offset local_38;
  PSNode *local_30;
  BinOp local_24;
  ret_type local_20;
  PSNodesSeq *local_18;
  PSNodesSeq *local_8;
  
  local_18 = in_RSI;
  local_20 = llvm::dyn_cast<llvm::AtomicRMWInst,llvm::Instruction_const>
                       ((Instruction *)in_stack_ffffffffffffff30);
  local_24 = llvm::AtomicRMWInst::getOperation((AtomicRMWInst *)0x1b8656);
  if (((local_24 == FIRST_BINOP) || (local_24 == Add)) || (local_24 == Sub)) {
    llvm::AtomicRMWInst::getPointerOperand((AtomicRMWInst *)0x1b86a7);
    local_30 = getOperand((LLVMPointerGraphBuilder *)
                          CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                          in_stack_ffffffffffffff30);
    Offset::Offset(&local_38,Offset::UNKNOWN);
    local_40 = PointerGraph::create<(dg::pta::PSNodeType)2,dg::pta::PSNode*&>
                         ((PointerGraph *)in_RDI,
                          (PSNode **)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    local_48 = (PSNode *)0x0;
    BVar1 = local_24;
    if (local_24 == FIRST_BINOP) {
      llvm::AtomicRMWInst::getValOperand((AtomicRMWInst *)0x1b8734);
      local_48 = getOperand((LLVMPointerGraphBuilder *)CONCAT44(BVar1,in_stack_ffffffffffffff38),
                            in_stack_ffffffffffffff30);
    }
    else if (local_24 == Add) {
      llvm::AtomicRMWInst::getValOperand((AtomicRMWInst *)0x1b8758);
      o = llvmutils::getConstantValue(in_stack_ffffffffffffff30);
      Offset::Offset(&local_50,o);
      Offset::operator=(&local_38,local_50);
      local_48 = PointerGraph::create<(dg::pta::PSNodeType)4,dg::pta::PSNode*&,dg::Offset&>
                           ((PointerGraph *)in_RDI,
                            (PSNode **)CONCAT44(BVar1,in_stack_ffffffffffffff38),
                            (Offset *)in_stack_ffffffffffffff30);
      SubgraphNode<dg::pta::PSNode>::addSuccessor
                (in_RDI,(PSNode *)CONCAT44(BVar1,in_stack_ffffffffffffff38));
    }
    else if (local_24 != Sub) {
      abort();
    }
    this_00 = PointerGraph::create<(dg::pta::PSNodeType)3,dg::pta::PSNode*&,dg::pta::PSNode*&>
                        ((PointerGraph *)in_RDI,(PSNode **)CONCAT44(BVar1,in_stack_ffffffffffffff38)
                         ,(PSNode **)in_stack_ffffffffffffff30);
    if ((local_24 == Add) || (local_24 == Sub)) {
      SubgraphNode<dg::pta::PSNode>::addSuccessor
                (in_RDI,(PSNode *)CONCAT44(BVar1,in_stack_ffffffffffffff38));
    }
    val = local_40;
    PSNodesSeq::PSNodesSeq(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    PSNodesSeq::PSNodesSeq(local_18,in_stack_ffffffffffffff28);
    local_8 = addNode((LLVMPointerGraphBuilder *)this_00,(Value *)val,in_stack_ffffffffffffff60);
    PSNodesSeq::~PSNodesSeq((PSNodesSeq *)0x1b8896);
    PSNodesSeq::~PSNodesSeq((PSNodesSeq *)0x1b88a0);
  }
  else {
    local_8 = createUnknown((LLVMPointerGraphBuilder *)in_RDI,
                            (Value *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  }
  return local_8;
}

Assistant:

LLVMPointerGraphBuilder::PSNodesSeq &
LLVMPointerGraphBuilder::createAtomicRMW(const llvm::Instruction *Inst) {
    using namespace llvm;

    const auto *RMW = dyn_cast<AtomicRMWInst>(Inst);
    assert(RMW && "Wrong instruction");

    auto operation = RMW->getOperation();
    if (operation != AtomicRMWInst::Xchg && operation != AtomicRMWInst::Add &&
        operation != AtomicRMWInst::Sub) {
        return createUnknown(Inst);
    }

    auto *ptr = getOperand(RMW->getPointerOperand());
    Offset cval = Offset::UNKNOWN;

    auto *R = PS.create<PSNodeType::LOAD>(ptr);

    PSNode *M = nullptr;
    switch (operation) {
    case AtomicRMWInst::Xchg:
        M = getOperand(RMW->getValOperand());
        break;
    case AtomicRMWInst::Add:
        cval = Offset(llvmutils::getConstantValue(RMW->getValOperand()));
        M = PS.create<PSNodeType::GEP>(ptr, cval);
        R->addSuccessor(M);
        break;
    case AtomicRMWInst::Sub:
        break;
        cval = Offset(0) -
               Offset(llvmutils::getConstantValue(RMW->getValOperand()));
        M = PS.create<PSNodeType::GEP>(ptr, cval);
        R->addSuccessor(M);
        break;
    default:
        assert(false && "Invalid operation");
        abort();
    }
    assert(M);

    auto *W = PS.create<PSNodeType::STORE>(M, ptr);
    if (operation == AtomicRMWInst::Add || operation == AtomicRMWInst::Sub) {
        M->addSuccessor(W);
    }

    PSNodesSeq ret({R, W});
    return addNode(Inst, ret);
}